

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFObjectHandle::copyStream(QPDFObjectHandle *this)

{
  element_type *peVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle *in_RSI;
  QPDF *pQVar3;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle *result;
  QPDFObjectHandle old_dict;
  QPDFObjectHandle dict;
  iterator __begin1;
  iterator __end1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f0;
  QPDFObjectHandle local_e0;
  QPDFObjectHandle local_d0;
  iterator local_c0;
  iterator local_78;
  
  assertStream(in_RSI);
  peVar1 = (in_RSI->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pQVar3 = (QPDF *)0x0;
  }
  else {
    pQVar3 = peVar1->qpdf;
  }
  newStream(this,pQVar3);
  getDict(&local_e0);
  getDict((QPDFObjectHandle *)&local_f0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_100,&local_f0);
  QPDFDictItems::begin(&local_c0,(QPDFDictItems *)&local_100);
  QPDFDictItems::end(&local_78,(QPDFDictItems *)&local_100);
  while( true ) {
    bVar2 = QPDFDictItems::iterator::operator!=(&local_c0,&local_78);
    if (!bVar2) break;
    QPDFDictItems::iterator::updateIValue(&local_c0);
    if ((local_c0.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0)
       || (((local_c0.ivalue.second.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og).obj == 0)) {
      shallowCopy(&local_d0);
      replaceKey(&local_e0,&local_c0.ivalue.first,&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_d0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      replaceKey(&local_e0,&local_c0.ivalue.first,&local_c0.ivalue.second);
    }
    QPDFDictItems::iterator::operator++(&local_c0);
  }
  QPDFDictItems::iterator::~iterator(&local_78);
  QPDFDictItems::iterator::~iterator(&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  peVar1 = (in_RSI->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pQVar3 = (QPDF *)0x0;
  }
  else {
    pQVar3 = peVar1->qpdf;
  }
  QPDF::StreamCopier::copyStreamData(pQVar3,this,in_RSI);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::copyStream()
{
    assertStream();
    QPDFObjectHandle result = newStream(this->getOwningQPDF());
    QPDFObjectHandle dict = result.getDict();
    QPDFObjectHandle old_dict = getDict();
    for (auto& iter: QPDFDictItems(old_dict)) {
        if (iter.second.isIndirect()) {
            dict.replaceKey(iter.first, iter.second);
        } else {
            dict.replaceKey(iter.first, iter.second.shallowCopy());
        }
    }
    QPDF::StreamCopier::copyStreamData(getOwningQPDF(), result, *this);
    return result;
}